

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_close_in_callback(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  
  uVar2 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir",0);
    if (iVar1 == 0) {
      iVar1 = uv_timer_init(uVar2,&timer);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
        if (iVar1 == 0) {
          uv_run(uVar2,0);
          uv_close(&timer,close_cb);
          uv_run(uVar2,1);
          if (close_cb_called == 2) {
            if (fs_event_cb_called == 3) {
              fs_event_unlink_files((uv_timer_t *)0x0);
              remove("watch_dir/");
              loop = (uv_loop_t *)uv_default_loop();
              close_loop(loop);
              uVar2 = uv_default_loop();
              iVar1 = uv_loop_close(uVar2);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar3 = "0 == uv_loop_close(uv_default_loop())";
              uVar2 = 0x3c2;
            }
            else {
              pcVar3 = "fs_event_cb_called == 3";
              uVar2 = 0x3bc;
            }
          }
          else {
            pcVar3 = "close_cb_called == 2";
            uVar2 = 0x3bb;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0x3b3;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x3b1;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x3ae;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x3ac;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_event_close_in_callback) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  fs_event_unlink_files(NULL);
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_close, "watch_dir", 0);
  ASSERT(r == 0);

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*)&timer, close_cb);

  uv_run(loop, UV_RUN_ONCE);

  ASSERT(close_cb_called == 2);
  ASSERT(fs_event_cb_called == 3);

  /* Clean up */
  fs_event_unlink_files(NULL);
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}